

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O0

int fft_segment_inv(mixed_segment *segment)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  float *in_stack_ffffffffffffff38;
  float *in_stack_ffffffffffffff40;
  float *in_stack_ffffffffffffff48;
  long fifo_latency;
  double expected;
  double bin_frequencies;
  long step;
  long framesize2;
  long k;
  long i;
  double window;
  double tmp;
  double phase;
  double magnitude;
  uint32_t out_samples;
  uint32_t in_samples;
  float *out;
  float *in;
  float *output_accumulator;
  float *phase_sum;
  float *fft_workspace;
  float *out_fifo;
  uint32_t oversampling;
  uint32_t framesize;
  fft_segment_data *data;
  mixed_segment *segment_local;
  
  _oversampling = (undefined8 *)segment->data;
  magnitude._4_4_ = *(uint *)((long)_oversampling + 0x14);
  out_fifo._0_4_ = *(uint *)(_oversampling + 3);
  fft_workspace = (float *)_oversampling[5];
  phase_sum = (float *)_oversampling[6];
  output_accumulator = (float *)_oversampling[7];
  in = (float *)_oversampling[8];
  magnitude._0_4_ = 0xffffffff;
  uVar4 = magnitude._4_4_ >> 1;
  uVar3 = (ulong)magnitude._4_4_ / (ulong)(uint)out_fifo;
  uVar2 = *(uint *)(_oversampling + 2);
  uVar6 = (ulong)magnitude._4_4_;
  uVar7 = (ulong)magnitude._4_4_;
  lVar8 = magnitude._4_4_ - uVar3;
  if (_oversampling[4] == 0) {
    _oversampling[4] = lVar8;
  }
  out_fifo._4_4_ = magnitude._4_4_;
  data = (fft_segment_data *)segment;
  mixed_buffer_request_write
            ((float **)&out_samples,(uint32_t *)&magnitude,(mixed_buffer *)_oversampling[1]);
  for (k = 0; k < (long)(ulong)magnitude._0_4_; k = k + 1) {
    _out_samples[k] = fft_workspace[_oversampling[4] - lVar8];
    _oversampling[4] = _oversampling[4] + 1;
    if ((long)(ulong)out_fifo._4_4_ <= (long)_oversampling[4]) {
      _oversampling[4] = lVar8;
      iVar5 = mixed_buffer_request_read
                        (&out,(uint32_t *)((long)&magnitude + 4),(mixed_buffer *)*_oversampling);
      if (iVar5 == 0) break;
      mixed_buffer_finish_read(magnitude._4_4_,(mixed_buffer *)*_oversampling);
      for (framesize2 = 0; framesize2 <= (long)(ulong)uVar4; framesize2 = framesize2 + 1) {
        in_stack_ffffffffffffff48 = (float *)(double)out[framesize2 * 2 + 1];
        output_accumulator[framesize2] =
             (float)((double)output_accumulator[framesize2] +
                    (double)framesize2 * (((double)uVar3 * 6.283185307179586) / (double)uVar7) +
                    ((((double)out[framesize2 * 2] -
                      (double)framesize2 * ((double)uVar2 / (double)uVar6)) /
                     ((double)uVar2 / (double)uVar6)) * 6.283185307179586) / (double)(uint)out_fifo)
        ;
        fVar1 = output_accumulator[framesize2];
        in_stack_ffffffffffffff40 = in_stack_ffffffffffffff48;
        dVar9 = cos((double)fVar1);
        phase_sum[framesize2 * 2] = (float)((double)in_stack_ffffffffffffff40 * dVar9);
        dVar9 = sin((double)fVar1);
        phase_sum[framesize2 * 2 + 1] = (float)((double)in_stack_ffffffffffffff48 * dVar9);
      }
      for (framesize2 = (long)(out_fifo._4_4_ + 2); framesize2 < (long)(ulong)(out_fifo._4_4_ << 1);
          framesize2 = framesize2 + 1) {
        phase_sum[framesize2] = 0.0;
      }
      spiral_fft_float((int)lVar8,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                       in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      for (framesize2 = 0; framesize2 < (long)(ulong)out_fifo._4_4_; framesize2 = framesize2 + 1) {
        dVar9 = cos(((double)framesize2 * 6.283185307179586) / (double)out_fifo._4_4_);
        in[framesize2] =
             (float)((double)in[framesize2] +
                    ((dVar9 * -0.5 + 0.5) * 2.0 * (double)phase_sum[framesize2 * 2]) /
                    (double)((ulong)uVar4 * (ulong)(uint)out_fifo));
      }
      for (framesize2 = 0; framesize2 < (long)uVar3; framesize2 = framesize2 + 1) {
        fft_workspace[framesize2] = in[framesize2];
      }
      memmove(in,in + uVar3,(ulong)out_fifo._4_4_ << 2);
    }
  }
  mixed_buffer_finish_write((uint32_t)k,(mixed_buffer *)_oversampling[1]);
  return 1;
}

Assistant:

VECTORIZE int fft_segment_inv(struct mixed_segment *segment){
  struct fft_segment_data *data = (struct fft_segment_data *)segment->data;
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  float *restrict out_fifo = data->fifo;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict phase_sum = data->phase;
  float *restrict output_accumulator = data->accumulator;

  float *restrict in, *restrict out;
  uint32_t in_samples = framesize;
  uint32_t out_samples = UINT32_MAX;

  double magnitude, phase, tmp, window;
  long i, k;
  long framesize2 = framesize/2;
  long step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  long fifo_latency = framesize-step;
  if (data->overlap == 0) data->overlap = fifo_latency;

  mixed_buffer_request_write(&out, &out_samples, data->out);
  for(i=0; i<out_samples; i++){
    out[i] = out_fifo[data->overlap-fifo_latency];
    data->overlap++;

    if(data->overlap >= framesize){
      data->overlap = fifo_latency;
      
      if(!mixed_buffer_request_read(&in, &in_samples, data->in))
        break;
      mixed_buffer_finish_read(in_samples, data->in);
      for(k=0; k<=framesize2; k++){
        tmp = in[k*2];
        magnitude = in[k*2+1];

        tmp -= (double)k*bin_frequencies;
        tmp /= bin_frequencies;
        tmp = 2.*M_PI*tmp/oversampling;
        tmp += (double)k*expected;
        phase_sum[k] += tmp;
        phase = phase_sum[k];

        fft_workspace[2*k] = magnitude*cos(phase);
        fft_workspace[2*k+1] = magnitude*sin(phase);
      } 

      for(k=framesize+2; k<2*framesize; k++) fft_workspace[k] = 0.;

      spiral_fft_float(framesize, +1, fft_workspace, fft_workspace);

      for(k=0; k<framesize; k++){
        window = -.5*cos(2.*M_PI*(double)k/(double)framesize)+.5;
        output_accumulator[k] += 2.*window*fft_workspace[2*k]/(framesize2*oversampling);
      }
      for(k=0; k<step; k++) out_fifo[k] = output_accumulator[k];

      memmove(output_accumulator, output_accumulator+step, framesize*sizeof(float));
    }
  }
  mixed_buffer_finish_write(i, data->out);

  return 1;
}